

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimizer.cpp
# Opt level: O0

PassToken __thiscall
spvtools::CreateAggressiveDCEPass(spvtools *this,bool preserve_interface,bool remove_outputs)

{
  unique_ptr<spvtools::opt::AggressiveDCEPass,_std::default_delete<spvtools::opt::AggressiveDCEPass>_>
  local_28;
  unique_ptr<spvtools::Optimizer::PassToken::Impl,_std::default_delete<spvtools::Optimizer::PassToken::Impl>_>
  local_20;
  bool local_12;
  bool local_11;
  bool remove_outputs_local;
  spvtools *psStack_10;
  bool preserve_interface_local;
  
  local_12 = remove_outputs;
  local_11 = preserve_interface;
  psStack_10 = this;
  MakeUnique<spvtools::opt::AggressiveDCEPass,bool&,bool&>
            ((spvtools *)&local_28,&local_11,&local_12);
  MakeUnique<spvtools::Optimizer::PassToken::Impl,std::unique_ptr<spvtools::opt::AggressiveDCEPass,std::default_delete<spvtools::opt::AggressiveDCEPass>>>
            ((spvtools *)&local_20,&local_28);
  Optimizer::PassToken::PassToken((PassToken *)this,&local_20);
  std::
  unique_ptr<spvtools::Optimizer::PassToken::Impl,_std::default_delete<spvtools::Optimizer::PassToken::Impl>_>
  ::~unique_ptr(&local_20);
  std::
  unique_ptr<spvtools::opt::AggressiveDCEPass,_std::default_delete<spvtools::opt::AggressiveDCEPass>_>
  ::~unique_ptr(&local_28);
  return (unique_ptr<spvtools::Optimizer::PassToken::Impl,_std::default_delete<spvtools::Optimizer::PassToken::Impl>_>
          )(unique_ptr<spvtools::Optimizer::PassToken::Impl,_std::default_delete<spvtools::Optimizer::PassToken::Impl>_>
            )this;
}

Assistant:

Optimizer::PassToken CreateAggressiveDCEPass(bool preserve_interface,
                                             bool remove_outputs) {
  return MakeUnique<Optimizer::PassToken::Impl>(
      MakeUnique<opt::AggressiveDCEPass>(preserve_interface, remove_outputs));
}